

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O1

void NJD_remove_silent_node(NJD *njd)

{
  int iVar1;
  char *__s1;
  NJDNode *node;
  
  node = njd->head;
  while (node != (NJDNode *)0x0) {
    __s1 = NJDNode_get_pron(node);
    iVar1 = strcmp(__s1,"*");
    if (iVar1 == 0) {
      node = NJD_remove_node(njd,node);
    }
    else {
      node = node->next;
    }
  }
  return;
}

Assistant:

void NJD_remove_silent_node(NJD * njd)
{
   NJDNode *node;

   for (node = njd->head; node != NULL;)
      if (strcmp(NJDNode_get_pron(node), "*") == 0)
         node = NJD_remove_node(njd, node);
      else
         node = node->next;
}